

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
gtl::
dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
::insert_at<S2CellIndex::LabelledCell>
          (iterator *__return_storage_ptr__,
          dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
          *this,LabelledCell *obj,size_type pos)

{
  pointer pLVar1;
  size_type sVar2;
  bool bVar3;
  length_error *this_00;
  
  if (0xaaaaaaaaaaaaaa9 < this->num_elements - this->num_deleted) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  bVar3 = test_deleted(this,pos);
  if (bVar3) {
    if (this->num_deleted == 0) {
      __assert_fail("num_deleted > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x493,
                    "iterator gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::insert_at(U &&, size_type) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>, U = S2CellIndex::LabelledCell]"
                   );
    }
    this->num_deleted = this->num_deleted - 1;
  }
  else {
    this->num_elements = this->num_elements + 1;
  }
  pLVar1 = this->table;
  pLVar1[pos].label = obj->label;
  pLVar1[pos].cell_id.id_ = (obj->cell_id).id_;
  pLVar1 = this->table;
  sVar2 = this->num_buckets;
  __return_storage_ptr__->ht = this;
  __return_storage_ptr__->pos = pLVar1 + pos;
  __return_storage_ptr__->end = pLVar1 + sVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator insert_at(U&& obj, size_type pos) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if ( test_deleted(pos) ) {      // just replace if it's been del.
      assert(num_deleted > 0);
      --num_deleted;                // used to be, now it isn't
    } else {
      ++num_elements;               // replacing an empty bucket
    }
    set_value(&table[pos], std::forward<U>(obj));
    return iterator(this, table + pos, table + num_buckets, false);
  }